

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5VocabInstanceNewTerm(Fts5VocabCursor *pCsr)

{
  long lVar1;
  int *pRc;
  long in_RDI;
  long in_FS_OFFSET;
  int bCmp;
  int nCmp;
  char *zTerm;
  int nTerm;
  int rc;
  u8 *in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffd4;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(char *)(*(long *)(in_RDI + 0x20) + 0x14) == '\0') {
    pRc = (int *)sqlite3Fts5IterTerm((Fts5IndexIter *)&DAT_aaaaaaaaaaaaaaaa,
                                     (int *)CONCAT44(in_stack_ffffffffffffffdc,
                                                     in_stack_ffffffffffffffd8));
    if (-1 < *(int *)(in_RDI + 0x30)) {
      if (*(int *)(in_RDI + 0x30) < -0x55555555) {
        in_stack_ffffffffffffffd4 = *(int *)(in_RDI + 0x30);
      }
      else {
        in_stack_ffffffffffffffd4 = -0x55555556;
      }
      in_stack_ffffffffffffffdc = in_stack_ffffffffffffffd4;
      in_stack_ffffffffffffffd8 =
           memcmp(*(void **)(in_RDI + 0x38),pRc,(long)in_stack_ffffffffffffffd4);
      if ((in_stack_ffffffffffffffd8 < 0) ||
         ((in_stack_ffffffffffffffd8 == 0 && (*(int *)(in_RDI + 0x30) < -0x55555556)))) {
        *(undefined4 *)(in_RDI + 0x18) = 1;
      }
    }
    sqlite3Fts5BufferSet
              (pRc,(Fts5Buffer *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
               in_stack_ffffffffffffffd4,in_stack_ffffffffffffffc8);
  }
  else {
    *(undefined4 *)(in_RDI + 0x18) = 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return 0;
}

Assistant:

static int fts5VocabInstanceNewTerm(Fts5VocabCursor *pCsr){
  int rc = SQLITE_OK;

  if( sqlite3Fts5IterEof(pCsr->pIter) ){
    pCsr->bEof = 1;
  }else{
    const char *zTerm;
    int nTerm;
    zTerm = sqlite3Fts5IterTerm(pCsr->pIter, &nTerm);
    if( pCsr->nLeTerm>=0 ){
      int nCmp = MIN(nTerm, pCsr->nLeTerm);
      int bCmp = memcmp(pCsr->zLeTerm, zTerm, nCmp);
      if( bCmp<0 || (bCmp==0 && pCsr->nLeTerm<nTerm) ){
        pCsr->bEof = 1;
      }
    }

    sqlite3Fts5BufferSet(&rc, &pCsr->term, nTerm, (const u8*)zTerm);
  }
  return rc;
}